

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xform.cpp
# Opt level: O0

double __thiscall ON_Xform::GetSurfaceNormalXform(ON_Xform *this,ON_Xform *N_xform)

{
  int iVar1;
  double dtol;
  double p;
  double d;
  double mrofx [4] [4];
  ON_Xform *N_xform_local;
  ON_Xform *this_local;
  
  N_xform->m_xform[0][0] = this->m_xform[0][0];
  N_xform->m_xform[0][1] = this->m_xform[0][1];
  N_xform->m_xform[0][2] = this->m_xform[0][2];
  N_xform->m_xform[0][3] = 0.0;
  N_xform->m_xform[1][0] = this->m_xform[1][0];
  N_xform->m_xform[1][1] = this->m_xform[1][1];
  N_xform->m_xform[1][2] = this->m_xform[1][2];
  N_xform->m_xform[1][3] = 0.0;
  N_xform->m_xform[2][0] = this->m_xform[2][0];
  N_xform->m_xform[2][1] = this->m_xform[2][1];
  N_xform->m_xform[2][2] = this->m_xform[2][2];
  N_xform->m_xform[2][3] = 0.0;
  N_xform->m_xform[3][0] = 0.0;
  N_xform->m_xform[3][1] = 0.0;
  N_xform->m_xform[3][2] = 0.0;
  N_xform->m_xform[3][3] = 1.0;
  p = 0.0;
  dtol = 0.0;
  mrofx[3][3] = (double)N_xform;
  iVar1 = Inv((double *)N_xform,(double (*) [4])&d,&p,&dtol);
  if ((((iVar1 != 4) || (ABS(p) <= 3.308722450213671e-24)) ||
      (1.0 <= ABS(p) * 3.308722450213671e-24)) || (ABS(dtol) <= ABS(p) * 2.220446049250313e-16)) {
    p = 0.0;
  }
  else {
    *(double *)mrofx[3][3] = d;
    *(double *)((long)mrofx[3][3] + 8) = mrofx[0][3];
    *(double *)((long)mrofx[3][3] + 0x10) = mrofx[1][3];
    *(double *)((long)mrofx[3][3] + 0x20) = mrofx[0][0];
    *(double *)((long)mrofx[3][3] + 0x28) = mrofx[1][0];
    *(double *)((long)mrofx[3][3] + 0x30) = mrofx[2][0];
    *(double *)((long)mrofx[3][3] + 0x40) = mrofx[0][1];
    *(double *)((long)mrofx[3][3] + 0x48) = mrofx[1][1];
    *(double *)((long)mrofx[3][3] + 0x50) = mrofx[2][1];
  }
  return p;
}

Assistant:

double ON_Xform::GetSurfaceNormalXform( ON_Xform& N_xform ) const
{
  // since were are transforming vectors, we don't need
  // the translation column or bottom row.
  memcpy(&N_xform.m_xform[0][0],&m_xform[0][0], 3*sizeof(N_xform.m_xform[0][0]) );
  N_xform.m_xform[0][3] = 0.0;
  memcpy(&N_xform.m_xform[1][0],&m_xform[1][0], 3*sizeof(N_xform.m_xform[0][0]) );
  N_xform.m_xform[1][3] = 0.0;
  memcpy(&N_xform.m_xform[2][0],&m_xform[2][0], 3*sizeof(N_xform.m_xform[0][0]) );
  N_xform.m_xform[2][3] = 0.0;
  N_xform.m_xform[3][0] = 0.0;
  N_xform.m_xform[3][1] = 0.0;
  N_xform.m_xform[3][2] = 0.0;
  N_xform.m_xform[3][3] = 1.0;

  double mrofx[4][4], d = 0.0, p = 0.0;
  double dtol = ON_SQRT_EPSILON*ON_SQRT_EPSILON*ON_SQRT_EPSILON;
  if ( 4 == Inv( &N_xform.m_xform[0][0], mrofx, &d, &p ) 
       && fabs(d) > dtol 
       && fabs(d)*dtol < 1.0
       && fabs(p) > ON_EPSILON*fabs(d)
     )
  {
    // Set N_xform = transpose of mrofx (only upper 3x3 matters)
    N_xform.m_xform[0][0] = mrofx[0][0];
    N_xform.m_xform[0][1] = mrofx[1][0]; 
    N_xform.m_xform[0][2] = mrofx[2][0];

    N_xform.m_xform[1][0] = mrofx[0][1];
    N_xform.m_xform[1][1] = mrofx[1][1];
    N_xform.m_xform[1][2] = mrofx[2][1];

    N_xform.m_xform[2][0] = mrofx[0][2];
    N_xform.m_xform[2][1] = mrofx[1][2];
    N_xform.m_xform[2][2] = mrofx[2][2];
  }
  else
  {
    d = 0.0;
  }
  return d;
}